

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::rehash
          (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  Entry *pEVar2;
  byte bVar3;
  ulong uVar4;
  Span *pSVar5;
  Entry *pEVar6;
  QPersistentModelIndexData *pQVar7;
  Data *pDVar8;
  Node<QPersistentModelIndex,_QEditorInfo> *pNVar9;
  ulong uVar10;
  ulong uVar11;
  size_t index;
  long lVar12;
  size_t numBuckets;
  Span *pSVar13;
  long lVar14;
  R RVar15;
  Bucket BVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar4 = this->numBuckets;
  pSVar5 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar4) {
    uVar10 = 0;
    pSVar13 = pSVar5;
    do {
      lVar12 = 0;
      do {
        bVar3 = pSVar13->offsets[lVar12];
        if (bVar3 != 0xff) {
          pEVar6 = pSVar5[uVar10].entries;
          uVar11 = *(ulong *)pEVar6[bVar3].storage.data;
          uVar11 = (uVar11 >> 0x20 ^ uVar11) * -0x2917014799a6026d;
          uVar11 = (uVar11 >> 0x20 ^ uVar11) * -0x2917014799a6026d;
          BVar16 = findBucketWithHash<QPersistentModelIndex>
                             (this,(QPersistentModelIndex *)(pEVar6 + bVar3),
                              uVar11 >> 0x20 ^ this->seed ^ uVar11);
          pNVar9 = Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::insert
                             (BVar16.span,BVar16.index);
          pQVar7 = *(QPersistentModelIndexData **)pEVar6[bVar3].storage.data;
          pDVar8 = *(Data **)(pEVar6[bVar3].storage.data + 8);
          pEVar2 = pEVar6 + bVar3;
          (pEVar2->storage).data[0] = '\0';
          (pEVar2->storage).data[1] = '\0';
          (pEVar2->storage).data[2] = '\0';
          (pEVar2->storage).data[3] = '\0';
          (pEVar2->storage).data[4] = '\0';
          (pEVar2->storage).data[5] = '\0';
          (pEVar2->storage).data[6] = '\0';
          (pEVar2->storage).data[7] = '\0';
          (pNVar9->key).d = pQVar7;
          (pNVar9->value).widget.wp.d = pDVar8;
          (pNVar9->value).widget.wp.value = *(QObject **)(pEVar6[bVar3].storage.data + 0x10);
          puVar1 = pEVar6[bVar3].storage.data + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          (pNVar9->value).isStatic = (bool)pEVar6[bVar3].storage.data[0x18];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::freeData(pSVar5 + uVar10);
      uVar10 = uVar10 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar10 != uVar4 >> 7);
  }
  if (pSVar5 != (Span *)0x0) {
    lVar12 = *(long *)&pSVar5[-1].allocated;
    if (lVar12 != 0) {
      lVar14 = lVar12 * 0x90;
      do {
        Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::freeData
                  ((Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)
                   (pSVar5[-1].offsets + lVar14));
        lVar14 = lVar14 + -0x90;
      } while (lVar14 != 0);
    }
    operator_delete__(&pSVar5[-1].allocated,lVar12 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }